

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

int chaiscript::dispatch::detail::call_func<std::function<int(int)>,int,int,0ul>
              (undefined8 param_1,function<int_(int)> *param_2,Function_Params *param_3,
              Type_Conversions_State *param_4)

{
  int iVar1;
  Boxed_Value *bv;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  function<int_(int)> *f_local;
  _func_int_int *param_0_local;
  
  bv = Function_Params::operator[](param_3,0);
  iVar1 = boxed_cast<int>(bv,param_4);
  iVar1 = std::function<int_(int)>::operator()(param_2,iVar1);
  return iVar1;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }